

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif_arg.cc
# Opt level: O0

void __thiscall
BuiltinFuncArg::BuiltinFuncArg
          (BuiltinFuncArg *this,char *arg_name,char *arg_type_str,char *arg_attr_str)

{
  int iVar1;
  undefined8 in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int i;
  int local_24;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 0xf;
  in_RDI[2] = in_RDX;
  in_RDI[3] = in_RCX;
  local_24 = 0;
  while (*builtin_func_arg_type[local_24].bif_type != '\0') {
    iVar1 = strcmp(builtin_func_arg_type[local_24].bif_type,in_RDX);
    if (iVar1 == 0) {
      *(int *)(in_RDI + 1) = local_24;
      in_RDI[2] = "";
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

BuiltinFuncArg::BuiltinFuncArg(const char* arg_name, const char* arg_type_str,
                               const char* arg_attr_str)
	{
	name = arg_name;
	type = TYPE_OTHER;
	type_str = arg_type_str;
	attr_str = arg_attr_str;

	for ( int i = 0; builtin_func_arg_type[i].bif_type[0] != '\0'; ++i )
		if ( ! strcmp(builtin_func_arg_type[i].bif_type, arg_type_str) )
			{
			type = i;
			type_str = "";
			}
	}